

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::UntypedPerformAction
          (FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this,void *untyped_action,void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  action;
  _Any_data _Stack_38;
  _Manager_type local_28;
  _Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_18;
  
  std::
  function<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_38,
             (function<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)untyped_action);
  local_18._M_head_impl = *untyped_args;
  Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Perform((Action<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&_Stack_38,(ArgumentTuple *)&local_18);
  pUVar1 = (UntypedActionResultHolderBase *)operator_new(8);
  pUVar1->_vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002755e0;
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return pUVar1;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }